

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasinterval.cpp
# Opt level: O0

void __thiscall LASinterval::LASinterval(LASinterval *this,U32 threshold)

{
  unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
  *this_00;
  U32 threshold_local;
  LASinterval *this_local;
  
  this_00 = (unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
             *)operator_new(0x38);
  std::
  unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
  ::unordered_map(this_00);
  this->cells = this_00;
  this->cells_to_merge = (void *)0x0;
  this->threshold = threshold;
  this->number_intervals = 0;
  this->last_index = -0x80000000;
  this->last_cell = (LASintervalStartCell *)0x0;
  this->current_cell = (LASintervalCell *)0x0;
  this->merged_cells = (LASintervalStartCell *)0x0;
  this->merged_cells_temporary = false;
  this->end = 0;
  this->full = 0;
  this->index = 0;
  this->start = 0;
  this->total = 0;
  return;
}

Assistant:

LASinterval::LASinterval(const U32 threshold)
{
  cells = new my_cell_hash;
  cells_to_merge = 0;
  this->threshold = threshold;
  number_intervals = 0;
  last_index = I32_MIN;
  last_cell = 0;
  current_cell = 0;
  merged_cells = 0;
  merged_cells_temporary = FALSE;
  end = 0;
  full = 0;
  index = 0;
  start = 0;
  total = 0;
}